

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

LexChar lex_more(LexState *ls)

{
  byte *pbVar1;
  long in_RDI;
  char *p;
  size_t sz;
  lua_State *in_stack_ffffffffffffffe8;
  uint local_4;
  
  pbVar1 = (byte *)(**(code **)(in_RDI + 0x50))
                             (*(undefined8 *)(in_RDI + 8),*(undefined8 *)(in_RDI + 0x58),
                              &stack0xffffffffffffffe8);
  if ((pbVar1 == (byte *)0x0) || (in_stack_ffffffffffffffe8 == (lua_State *)0x0)) {
    local_4 = 0xffffffff;
  }
  else {
    if ((lua_State *)0x7ffffeff < in_stack_ffffffffffffffe8) {
      if (in_stack_ffffffffffffffe8 != (lua_State *)0xffffffffffffffff) {
        lj_err_mem(in_stack_ffffffffffffffe8);
      }
      in_stack_ffffffffffffffe8 = (lua_State *)(-(long)pbVar1 - 1);
      if ((lua_State *)0x7ffffeff < in_stack_ffffffffffffffe8) {
        in_stack_ffffffffffffffe8 = (lua_State *)0x7ffffeff;
      }
      *(undefined4 *)(in_RDI + 0xa0) = 1;
    }
    *(byte **)(in_RDI + 0x28) = pbVar1 + (long)in_stack_ffffffffffffffe8;
    *(byte **)(in_RDI + 0x20) = pbVar1 + 1;
    local_4 = (uint)*pbVar1;
  }
  return local_4;
}

Assistant:

static LJ_NOINLINE LexChar lex_more(LexState *ls)
{
  size_t sz;
  const char *p = ls->rfunc(ls->L, ls->rdata, &sz);
  if (p == NULL || sz == 0) return LEX_EOF;
  if (sz >= LJ_MAX_BUF) {
    if (sz != ~(size_t)0) lj_err_mem(ls->L);
    sz = ~(uintptr_t)0 - (uintptr_t)p;
    if (sz >= LJ_MAX_BUF) sz = LJ_MAX_BUF-1;
    ls->endmark = 1;
  }
  ls->pe = p + sz;
  ls->p = p + 1;
  return (LexChar)(uint8_t)p[0];
}